

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.h
# Opt level: O2

void aeron::defaultErrorHandler(exception *exception)

{
  ostream *poVar1;
  char *pcVar2;
  long lVar3;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"ERROR: ");
  pcVar2 = (char *)(**(code **)(*(long *)exception + 0x10))(exception);
  std::operator<<(poVar1,pcVar2);
  lVar3 = __dynamic_cast(exception,&std::exception::typeinfo,&util::SourcedException::typeinfo,0);
  if (lVar3 == 0) {
    __cxa_bad_cast();
  }
  poVar1 = std::operator<<((ostream *)&std::cerr," : ");
  std::operator<<(poVar1,*(char **)(lVar3 + 8));
  std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  exit(-1);
}

Assistant:

inline void defaultErrorHandler(const std::exception& exception)
{
    std::cerr << "ERROR: " << exception.what();

    try
    {
        const SourcedException& sourcedException = dynamic_cast<const SourcedException&>(exception);
        std::cerr << " : " << sourcedException.where();
    }
    catch (const std::bad_cast&)
    {
        // ignore
    }

    std::cerr << std::endl;
    ::exit(-1);
}